

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::Lock(Mutex *this)

{
  ulong uVar1;
  bool bVar2;
  GraphId id_00;
  intptr_t v;
  GraphId id;
  Mutex *this_local;
  memory_order __b;
  
  id_00 = DebugOnlyDeadlockCheck(this);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar2) goto LAB_001ad420;
  }
  bVar2 = TryAcquireWithSpinning(&this->mu_);
  if (!bVar2) {
    LockSlow(this,(MuHow)kExclusiveS,(Condition *)0x0,0);
  }
LAB_001ad420:
  DebugOnlyLockEnter(this,id_00);
  return;
}

Assistant:

void Mutex::Lock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, 0);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // try fast acquire, then spin loop
  if ((v & (kMuWriter | kMuReader | kMuEvent)) != 0 ||
      !mu_.compare_exchange_strong(v, kMuWriter | v,
                                   std::memory_order_acquire,
                                   std::memory_order_relaxed)) {
    // try spin acquire, then slow loop
    if (!TryAcquireWithSpinning(&this->mu_)) {
      this->LockSlow(kExclusive, nullptr, 0);
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, 0, 0);
}